

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhash.cc
# Opt level: O0

void * OPENSSL_lh_delete(_LHASH *lh,void *data,lhash_hash_func_helper call_hash_func,
                        lhash_cmp_func_helper call_cmp_func)

{
  LHASH_ITEM *orig_ptr;
  LHASH_ITEM **ppLVar1;
  LHASH_ITEM *ret;
  LHASH_ITEM *item;
  LHASH_ITEM **next_ptr;
  lhash_cmp_func_helper call_cmp_func_local;
  lhash_hash_func_helper call_hash_func_local;
  void *data_local;
  _LHASH *lh_local;
  
  ppLVar1 = get_next_ptr_and_hash(lh,(uint32_t *)0x0,data,call_hash_func,call_cmp_func);
  if (*ppLVar1 == (LHASH_ITEM *)0x0) {
    lh_local = (_LHASH *)0x0;
  }
  else {
    orig_ptr = *ppLVar1;
    *ppLVar1 = orig_ptr->next;
    lh_local = (_LHASH *)orig_ptr->data;
    OPENSSL_free(orig_ptr);
    lh->num_items = lh->num_items - 1;
    lh_maybe_resize(lh);
  }
  return lh_local;
}

Assistant:

void *OPENSSL_lh_delete(_LHASH *lh, const void *data,
                        lhash_hash_func_helper call_hash_func,
                        lhash_cmp_func_helper call_cmp_func) {
  LHASH_ITEM **next_ptr, *item, *ret;

  next_ptr =
      get_next_ptr_and_hash(lh, NULL, data, call_hash_func, call_cmp_func);

  if (*next_ptr == NULL) {
    // No such element.
    return NULL;
  }

  item = *next_ptr;
  *next_ptr = item->next;
  ret = reinterpret_cast<LHASH_ITEM *>(item->data);
  OPENSSL_free(item);

  lh->num_items--;
  lh_maybe_resize(lh);

  return ret;
}